

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall
cs_impl::
cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs_impl::any_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs_impl::any_&)>
::call(cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs_impl::any_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs_impl::any_&)>
       *this,vector *args)

{
  size_type sVar1;
  runtime_error *this_00;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  proxy *in_RDI;
  string *in_stack_fffffffffffffee8;
  any *val;
  proxy *__lhs;
  any local_f0 [2];
  any *in_stack_ffffffffffffff20;
  sequence<0,_1,_2> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs_impl::any_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs_impl::any_&)>
  *in_stack_ffffffffffffff38;
  
  __lhs = in_RDI;
  sVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
  if (sVar1 != 3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff28);
    std::operator+(&__lhs->is_rvalue,(any *)this_00);
    std::operator+((any *)__lhs,(char *)this_00);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff28);
    std::operator+((any *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    cs::runtime_error::runtime_error(this_00,in_stack_fffffffffffffee8);
    __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  val = local_f0;
  cni_helper<std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs_impl::any_const&),std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs_impl::any_const&)>
  ::_call<0,1,2>(in_stack_ffffffffffffff38,
                 (vector *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
  return_to_cs<std::__cxx11::string>(val);
  std::__cxx11::string::~string((string *)local_f0);
  return (any)in_RDI;
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}